

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

void embree::SceneGraph::resize_randomly
               (RandomSampler *sampler,Ref<embree::SceneGraph::Node> *node,size_t N)

{
  undefined4 uVar1;
  Node *pNVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long *plVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  size_t i;
  ulong uVar12;
  size_t sVar13;
  size_t i_2;
  long lVar14;
  Ref<embree::SceneGraph::Node> local_40;
  Ref<embree::SceneGraph::Node> local_38;
  
  pNVar2 = node->ptr;
  if (pNVar2 != (Node *)0x0) {
    plVar7 = (long *)__dynamic_cast(pNVar2,&Node::typeinfo,&TransformNode::typeinfo,0);
    if (plVar7 == (long *)0x0) {
      plVar7 = (long *)__dynamic_cast(pNVar2,&Node::typeinfo,&GroupNode::typeinfo,0);
      if (plVar7 == (long *)0x0) {
        plVar7 = (long *)__dynamic_cast(pNVar2,&Node::typeinfo,&TriangleMeshNode::typeinfo,0);
        if (plVar7 == (long *)0x0) {
          plVar7 = (long *)__dynamic_cast(pNVar2,&Node::typeinfo,&QuadMeshNode::typeinfo,0);
          if (plVar7 == (long *)0x0) {
            plVar7 = (long *)__dynamic_cast(pNVar2,&Node::typeinfo,&HairSetNode::typeinfo,0);
            if (plVar7 == (long *)0x0) {
              plVar7 = (long *)__dynamic_cast(pNVar2,&Node::typeinfo,&PointSetNode::typeinfo,0);
              if (plVar7 == (long *)0x0) {
                plVar7 = (long *)__dynamic_cast(pNVar2,&Node::typeinfo,&SubdivMeshNode::typeinfo,0);
                if (plVar7 != (long *)0x0) {
                  (**(code **)(*plVar7 + 0x10))(plVar7);
                  if (N < (ulong)(plVar7[0x23] - plVar7[0x22] >> 2)) {
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               (plVar7 + 0x22),N);
                    (**(code **)(*plVar7 + 0x18))(plVar7);
                  }
                  else {
                    (**(code **)(*plVar7 + 0x18))(plVar7);
                  }
                }
              }
              else {
                (**(code **)(*plVar7 + 0x10))(plVar7);
                if (N < (ulong)(plVar7[0x10] - plVar7[0xf] >> 5)) {
                  std::
                  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  ::resize((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                            *)(plVar7 + 0xf),N);
                  (**(code **)(*plVar7 + 0x18))(plVar7);
                }
                else {
                  (**(code **)(*plVar7 + 0x18))(plVar7);
                }
              }
            }
            else {
              (**(code **)(*plVar7 + 0x10))(plVar7);
              if (plVar7[0x1c] == plVar7[0x1b]) {
                (**(code **)(*plVar7 + 0x18))(plVar7);
              }
              else {
                for (uVar12 = 0; N != uVar12; uVar12 = uVar12 + 1) {
                  uVar10 = sampler->s * 0x19660d + 0x3c6ef35f;
                  sampler->s = uVar10;
                  lVar14 = plVar7[0x1b];
                  uVar8 = plVar7[0x1c] - lVar14 >> 3;
                  sVar13 = N;
                  if (uVar8 < N) {
                    sVar13 = uVar8;
                  }
                  uVar11 = (ulong)(uVar10 >> 1) % sVar13;
                  if (uVar12 < uVar8) {
                    uVar4 = *(undefined8 *)(lVar14 + uVar12 * 8);
                    *(undefined8 *)(lVar14 + uVar12 * 8) = *(undefined8 *)(lVar14 + uVar11 * 8);
                    *(undefined8 *)(lVar14 + uVar11 * 8) = uVar4;
                  }
                  else {
                    std::
                    vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                    ::push_back((vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                                 *)(plVar7 + 0x1b),(value_type *)(lVar14 + uVar11 * 8));
                  }
                }
                (**(code **)(*plVar7 + 0x18))(plVar7);
              }
            }
          }
          else {
            (**(code **)(*plVar7 + 0x10))(plVar7);
            if (plVar7[0x18] == plVar7[0x17]) {
              (**(code **)(*plVar7 + 0x18))(plVar7);
            }
            else {
              lVar14 = 0;
              for (uVar12 = 0; N != uVar12; uVar12 = uVar12 + 1) {
                uVar10 = sampler->s * 0x19660d + 0x3c6ef35f;
                sampler->s = uVar10;
                lVar3 = plVar7[0x17];
                uVar8 = plVar7[0x18] - lVar3 >> 4;
                sVar13 = N;
                if (uVar8 < N) {
                  sVar13 = uVar8;
                }
                lVar9 = ((ulong)(uVar10 >> 1) % sVar13) * 0x10;
                if (uVar12 < uVar8) {
                  uVar4 = *(undefined8 *)(lVar3 + lVar14);
                  uVar5 = ((undefined8 *)(lVar3 + lVar14))[1];
                  uVar6 = ((undefined8 *)(lVar3 + lVar9))[1];
                  *(undefined8 *)(lVar3 + lVar14) = *(undefined8 *)(lVar3 + lVar9);
                  ((undefined8 *)(lVar3 + lVar14))[1] = uVar6;
                  *(undefined8 *)(lVar3 + lVar9) = uVar4;
                  ((undefined8 *)(lVar3 + lVar9))[1] = uVar5;
                }
                else {
                  std::
                  vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                  ::push_back((vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                               *)(plVar7 + 0x17),(value_type *)(lVar3 + lVar9));
                }
                lVar14 = lVar14 + 0x10;
              }
              (**(code **)(*plVar7 + 0x18))(plVar7);
            }
          }
        }
        else {
          (**(code **)(*plVar7 + 0x10))(plVar7);
          if (plVar7[0x18] == plVar7[0x17]) {
            (**(code **)(*plVar7 + 0x18))(plVar7);
          }
          else {
            lVar14 = 0;
            for (uVar12 = 0; N != uVar12; uVar12 = uVar12 + 1) {
              uVar10 = sampler->s * 0x19660d + 0x3c6ef35f;
              sampler->s = uVar10;
              lVar3 = plVar7[0x17];
              uVar8 = (plVar7[0x18] - lVar3) / 0xc;
              sVar13 = N;
              if (uVar8 < N) {
                sVar13 = uVar8;
              }
              lVar9 = ((ulong)(uVar10 >> 1) % sVar13) * 0xc;
              if (uVar12 < uVar8) {
                uVar1 = *(undefined4 *)(lVar3 + 8 + lVar14);
                uVar4 = *(undefined8 *)(lVar3 + lVar14);
                *(undefined4 *)(lVar3 + 8 + lVar14) = *(undefined4 *)(lVar3 + 8 + lVar9);
                *(undefined8 *)(lVar3 + lVar14) = *(undefined8 *)(lVar3 + lVar9);
                *(undefined4 *)(lVar3 + 8 + lVar9) = uVar1;
                *(undefined8 *)(lVar3 + lVar9) = uVar4;
              }
              else {
                std::
                vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                ::push_back((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                             *)(plVar7 + 0x17),(value_type *)(lVar3 + lVar9));
              }
              lVar14 = lVar14 + 0xc;
            }
            (**(code **)(*plVar7 + 0x18))(plVar7);
          }
        }
      }
      else {
        (**(code **)(*plVar7 + 0x10))(plVar7);
        uVar12 = 0;
        while( true ) {
          if ((ulong)(plVar7[0xe] - plVar7[0xd] >> 3) <= uVar12) break;
          pNVar2 = *(Node **)(plVar7[0xd] + uVar12 * 8);
          local_40.ptr = pNVar2;
          if (pNVar2 != (Node *)0x0) {
            (*(pNVar2->super_RefCount)._vptr_RefCount[2])(pNVar2);
          }
          resize_randomly(sampler,&local_40,N);
          if (pNVar2 != (Node *)0x0) {
            (*(pNVar2->super_RefCount)._vptr_RefCount[3])(pNVar2);
          }
          uVar12 = uVar12 + 1;
        }
        (**(code **)(*plVar7 + 0x18))(plVar7);
      }
    }
    else {
      (**(code **)(*plVar7 + 0x10))(plVar7);
      pNVar2 = (Node *)plVar7[0x13];
      local_38.ptr = pNVar2;
      if (pNVar2 != (Node *)0x0) {
        (*(pNVar2->super_RefCount)._vptr_RefCount[2])(pNVar2);
      }
      resize_randomly(sampler,&local_38,N);
      if (pNVar2 != (Node *)0x0) {
        (*(pNVar2->super_RefCount)._vptr_RefCount[3])(pNVar2);
      }
      (**(code **)(*plVar7 + 0x18))(plVar7);
    }
  }
  return;
}

Assistant:

void SceneGraph::HairSetNode::print(std::ostream& cout, int depth) {
    cout << "HairSetNode @ " << this << " { closed = " << closed << " }" << std::endl;
  }